

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

int test_contexts_cipher(char *name,int enc,int acpkm)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int in_EDX;
  int in_ESI;
  char *pcVar4;
  char *in_RDI;
  EVP_CIPHER_CTX *copy;
  int i;
  size_t v_1;
  OSSL_PARAM params_1 [2];
  size_t v;
  OSSL_PARAM params [2];
  EVP_CIPHER *type;
  int test;
  int ret;
  int tmplen;
  int outlen;
  uchar iv [16];
  uchar K [32];
  uchar c [256];
  uchar b [256];
  uchar pt [256];
  EVP_CIPHER_CTX *save;
  EVP_CIPHER_CTX *ctx;
  bool local_49a;
  bool local_499;
  EVP_CIPHER_CTX *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined1 local_478 [40];
  long local_450;
  undefined1 local_448 [80];
  undefined1 local_3f8 [40];
  long local_3d0;
  undefined1 local_3c8 [88];
  EVP_CIPHER *local_370;
  uint local_368;
  uint local_364;
  int local_360;
  uint local_35c;
  uchar local_358 [304];
  uchar local_228 [256];
  uchar local_128 [264];
  EVP_CIPHER_CTX *local_20;
  EVP_CIPHER_CTX *local_18;
  int local_10;
  int local_c;
  char *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_128,0,0x100);
  local_128[0] = '\x01';
  local_358[0x10] = '\x01';
  local_358[0x11] = '\0';
  local_358[0x12] = '\0';
  local_358[0x13] = '\0';
  local_358[0x14] = '\0';
  local_358[0x15] = '\0';
  local_358[0x16] = '\0';
  local_358[0x17] = '\0';
  local_358[0x18] = '\0';
  local_358[0x19] = '\0';
  local_358[0x1a] = '\0';
  local_358[0x1b] = '\0';
  local_358[0x1c] = '\0';
  local_358[0x1d] = '\0';
  local_358[0x1e] = '\0';
  local_358[0x1f] = '\0';
  local_358[0x20] = '\0';
  local_358[0x21] = '\0';
  local_358[0x22] = '\0';
  local_358[0x23] = '\0';
  local_358[0x24] = '\0';
  local_358[0x25] = '\0';
  local_358[0x26] = '\0';
  local_358[0x27] = '\0';
  local_358[0x28] = '\0';
  local_358[0x29] = '\0';
  local_358[0x2a] = '\0';
  local_358[0x2b] = '\0';
  local_358[0x2c] = '\0';
  local_358[0x2d] = '\0';
  local_358[0x2e] = '\0';
  local_358[0x2f] = '\0';
  local_358[0] = '\x01';
  local_358[1] = '\0';
  local_358[2] = '\0';
  local_358[3] = '\0';
  local_358[4] = '\0';
  local_358[5] = '\0';
  local_358[6] = '\0';
  local_358[7] = '\0';
  local_358[8] = '\0';
  local_358[9] = '\0';
  local_358[10] = '\0';
  local_358[0xb] = '\0';
  local_358[0xc] = '\0';
  local_358[0xd] = '\0';
  local_358[0xe] = '\0';
  local_358[0xf] = '\0';
  local_364 = 0;
  local_368 = 0;
  ERR_set_mark();
  local_370 = EVP_get_cipherbyname(local_8);
  if ((local_370 == (EVP_CIPHER *)0x0) &&
     (local_370 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,local_8), local_370 == (EVP_CIPHER *)0x0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("(type = (EVP_CIPHER *)EVP_get_cipherbyname(name)) || (type = EVP_CIPHER_fetch(NULL, name, NULL))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x46);
  }
  ERR_pop_to_mark();
  pcVar4 = "Decryption";
  if (local_c != 0) {
    pcVar4 = "Encryption";
  }
  printf("\x1b[1;34m%s test for %s\x1b[m\n",pcVar4,local_8);
  local_18 = EVP_CIPHER_CTX_new();
  if (local_18 == (EVP_CIPHER_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x4e);
  }
  iVar1 = EVP_CipherInit_ex(local_18,local_370,(ENGINE *)0x0,local_358 + 0x10,local_358,local_c);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x4f);
  }
  if (local_10 != 0) {
    lVar3 = EVP_CIPHER_get0_provider(local_370);
    if (lVar3 == 0) {
      iVar1 = EVP_CIPHER_CTX_ctrl(local_18,0x20,local_10,(void *)0x0);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x58);
      }
    }
    else {
      memset(local_3c8,0,0x50);
      local_3d0 = (long)local_10;
      OSSL_PARAM_construct_size_t(local_3f8,"key-mesh",&local_3d0);
      memcpy(local_3c8,local_3f8,0x28);
      iVar1 = EVP_CIPHER_CTX_set_params(local_18);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_set_params(ctx, params)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x56);
      }
    }
  }
  iVar1 = EVP_CIPHER_CTX_set_padding(local_18,0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CIPHER_CTX_set_padding(ctx, 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x5b);
  }
  iVar1 = EVP_CipherUpdate(local_18,local_228,(int *)&local_35c,local_128,0x100);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x5c);
  }
  iVar1 = EVP_CipherFinal_ex(local_18,local_228 + (int)local_35c,&local_360);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherFinal_ex(ctx, b + outlen, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x5d);
  }
  EVP_CIPHER_CTX_reset(local_18);
  EVP_CIPHER_CTX_reset(local_18);
  iVar1 = EVP_CipherInit_ex(local_18,local_370,(ENGINE *)0x0,local_358 + 0x10,local_358,local_c);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x62);
  }
  iVar1 = EVP_CIPHER_CTX_set_padding(local_18,0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CIPHER_CTX_set_padding(ctx, 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,99);
  }
  if (local_10 != 0) {
    lVar3 = EVP_CIPHER_get0_provider(local_370);
    if (lVar3 == 0) {
      iVar1 = EVP_CIPHER_CTX_ctrl(local_18,0x20,local_10,(void *)0x0);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x6c);
      }
    }
    else {
      memset(local_448,0,0x50);
      local_450 = (long)local_10;
      OSSL_PARAM_construct_size_t(local_478,"key-mesh",&local_450);
      memcpy(local_448,local_478,0x28);
      iVar1 = EVP_CIPHER_CTX_set_params(local_18);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_set_params(ctx, params)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x6a);
      }
    }
  }
  local_20 = local_18;
  printf(" cloned contexts: ");
  memset(local_358 + 0x30,0,0x100);
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    in_stack_fffffffffffffb78 = EVP_CIPHER_CTX_new();
    if (in_stack_fffffffffffffb78 == (EVP_CIPHER_CTX *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("copy",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x76);
    }
    iVar2 = EVP_CIPHER_CTX_copy(in_stack_fffffffffffffb78,local_18);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CIPHER_CTX_copy(copy, ctx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x77);
    }
    if (local_20 != local_18) {
      EVP_CIPHER_CTX_free(local_18);
    }
    local_18 = in_stack_fffffffffffffb78;
    iVar2 = EVP_CipherUpdate(in_stack_fffffffffffffb78,local_358 + (long)(iVar1 << 4) + 0x30,
                             (int *)&local_35c,local_128 + (iVar1 << 4),0x10);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen, pt + STEP_SIZE * i, STEP_SIZE)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x7d);
    }
  }
  local_35c = iVar1 << 4;
  iVar2 = EVP_CipherFinal_ex(local_18,local_358 + (long)(int)local_35c + 0x30,&local_360);
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherFinal_ex(ctx, c + outlen, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x81);
  }
  local_499 = true;
  if (local_35c == 0x100) {
    iVar2 = memcmp(local_358 + 0x30,local_228,0x100);
    local_499 = iVar2 != 0;
  }
  local_368 = (uint)local_499;
  if (local_499 == false) {
    printf("\x1b[1;32m  Test passed\x1b[m\n");
  }
  else {
    printf("\x1b[1;31m  Test FAILED\x1b[m\n");
  }
  EVP_CIPHER_CTX_free(local_18);
  if (local_368 != 0) {
    printf("  b[%d] = ",(ulong)local_35c);
    hexdump((void *)CONCAT44(iVar1,in_stack_fffffffffffffb80),(size_t)in_stack_fffffffffffffb78);
    printf("  c[%d] = ",(ulong)local_35c);
    hexdump((void *)CONCAT44(iVar1,in_stack_fffffffffffffb80),(size_t)in_stack_fffffffffffffb78);
  }
  local_364 = local_368 | local_364;
  printf("    base context: ");
  memset(local_358 + 0x30,0,0x100);
  iVar2 = EVP_CipherUpdate(local_20,local_358 + 0x30,(int *)&local_35c,local_128,0x100);
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x8f);
  }
  iVar2 = EVP_CipherFinal_ex(local_20,local_358 + (long)(int)local_35c + 0x30,&local_360);
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherFinal_ex(save, c + outlen, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0x90);
  }
  local_49a = true;
  if (local_35c == 0x100) {
    iVar2 = memcmp(local_358 + 0x30,local_228,0x100);
    local_49a = iVar2 != 0;
  }
  local_368 = (uint)local_49a;
  if (local_49a == false) {
    printf("\x1b[1;32m  Test passed\x1b[m\n");
  }
  else {
    printf("\x1b[1;31m  Test FAILED\x1b[m\n");
  }
  EVP_CIPHER_CTX_reset(local_20);
  EVP_CIPHER_CTX_reset(local_20);
  EVP_CIPHER_CTX_free(local_20);
  EVP_CIPHER_free(local_370);
  if (local_368 != 0) {
    printf("  b[%d] = ",(ulong)local_35c);
    hexdump((void *)CONCAT44(iVar1,in_stack_fffffffffffffb80),(size_t)in_stack_fffffffffffffb78);
    printf("  c[%d] = ",(ulong)local_35c);
    hexdump((void *)CONCAT44(iVar1,in_stack_fffffffffffffb80),(size_t)in_stack_fffffffffffffb78);
  }
  return local_368 | local_364;
}

Assistant:

static int test_contexts_cipher(const char *name, const int enc, int acpkm)
{
    EVP_CIPHER_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[TEST_SIZE]; /* base output */
    unsigned char c[TEST_SIZE]; /* cloned output */
    unsigned char K[32] = {1};
    unsigned char iv[16] = {1};
    int outlen, tmplen;
    int ret = 0, test = 0;

    EVP_CIPHER *type;
    ERR_set_mark();
    T((type = (EVP_CIPHER *)EVP_get_cipherbyname(name))
      || (type = EVP_CIPHER_fetch(NULL, name, NULL)));
    ERR_pop_to_mark();

    printf(cBLUE "%s test for %s" cNORM "\n",
           enc ? "Encryption" : "Decryption", name);

    /* produce base encryption */
    ctx = EVP_CIPHER_CTX_new();
    T(ctx);
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    T(EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b)));
    T(EVP_CipherFinal_ex(ctx, b + outlen, &tmplen));

    /* and now tests */
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_reset(ctx); /* double call is intentional */
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    save = ctx;

    printf(" cloned contexts: ");
    int i;
    memset(c, 0, sizeof(c));
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	EVP_CIPHER_CTX *copy = EVP_CIPHER_CTX_new();
	T(copy);
	T(EVP_CIPHER_CTX_copy(copy, ctx));
	if (save != ctx) /* else original context */
	    EVP_CIPHER_CTX_free(ctx);
	ctx = copy;

	T(EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen,
			   pt + STEP_SIZE * i, STEP_SIZE));
    }

    outlen = i * STEP_SIZE;
    T(EVP_CipherFinal_ex(ctx, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* resume original context */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c)));
    T(EVP_CipherFinal_ex(save, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_cleanup(save); /* multiple calls are intentional */
    EVP_CIPHER_CTX_cleanup(save);
    EVP_CIPHER_CTX_free(save);
    EVP_CIPHER_free(type);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}